

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.hpp
# Opt level: O0

Texture3D * __thiscall
deqp::gls::FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Texture3D>(FboBuilder *this)

{
  Texture3D *this_00;
  Texture3D *local_30 [3];
  Texture3D *local_18;
  Texture3D *cfg;
  FboBuilder *this_local;
  
  cfg = (Texture3D *)this;
  this_00 = (Texture3D *)operator_new(0x20);
  (this_00->super_TextureLayered).super_Texture.super_Image.width = 0;
  (this_00->super_TextureLayered).super_Texture.super_Image.height = 0;
  *(undefined8 *)&(this_00->super_TextureLayered).super_Texture.numLevels = 0;
  (this_00->super_TextureLayered).super_Texture.super_Image.super_Config._vptr_Config =
       (_func_int **)0x0;
  (this_00->super_TextureLayered).super_Texture.super_Image.internalFormat.format = 0;
  (this_00->super_TextureLayered).super_Texture.super_Image.internalFormat.unsizedType = 0;
  FboUtil::config::Texture3D::Texture3D(this_00);
  local_30[0] = this_00;
  local_18 = this_00;
  std::
  set<deqp::gls::FboUtil::config::Config_*,_std::less<deqp::gls::FboUtil::config::Config_*>,_std::allocator<deqp::gls::FboUtil::config::Config_*>_>
  ::insert(&this->m_configs,(value_type *)local_30);
  return local_18;
}

Assistant:

Config&						makeConfig		(void)
	{
		Config* cfg = new Config();
		m_configs.insert(cfg);
		return *cfg;
	}